

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O0

int Hsh_IntManHash(uint *pData,int nSize,int nTableSize)

{
  uint local_2c;
  uint Key;
  int nChars;
  int c;
  uchar *pDataC;
  int nTableSize_local;
  int nSize_local;
  uint *pData_local;
  
  local_2c = 0;
  for (Key = 0; (int)Key < nSize << 2; Key = Key + 1) {
    local_2c = (uint)*(byte *)((long)pData + (long)(int)Key) *
               Hsh_IntManHash::s_Primes[(int)Key % 7] + local_2c;
  }
  return local_2c % (uint)nTableSize;
}

Assistant:

static inline int Hsh_IntManHash( unsigned * pData, int nSize, int nTableSize )
{
    static int s_Primes[7] = { 4177, 5147, 5647, 6343, 7103, 7873, 8147 };
    unsigned char * pDataC = (unsigned char *)pData;
    int c, nChars = nSize * 4;
    unsigned Key = 0;
    for ( c = 0; c < nChars; c++ )
        Key += pDataC[c] * s_Primes[c % 7];
    return (int)(Key % nTableSize);
}